

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat.cpp
# Opt level: O0

void __thiscall Mat::Resize(Mat *this,int newn)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  int *piVar3;
  double *local_78;
  int local_50;
  int i;
  undefined1 local_28 [8];
  Mat ytemp;
  int newn_local;
  Mat *this_local;
  
  ytemp.v_._4_4_ = newn;
  Mat((Mat *)local_28,this);
  if (ytemp.v_._4_4_ != this->n_cols_ * this->n_rows_) {
    if ((this->v_ != (double *)0x0) && (this->v_ != (double *)0x0)) {
      operator_delete__(this->v_);
    }
    this->n_rows_ = ytemp.v_._4_4_;
    this->n_cols_ = 1;
    if (this->n_rows_ * this->n_cols_ < 1) {
      local_78 = (double *)0x0;
    }
    else {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = (long)this->n_rows_;
      uVar2 = SUB168(auVar1 * ZEXT816(8),0);
      if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
        uVar2 = 0xffffffffffffffff;
      }
      local_78 = (double *)operator_new__(uVar2);
    }
    this->v_ = local_78;
    for (local_50 = 0; piVar3 = std::min<int>(&this->n_rows_,(int *)local_28), local_50 < *piVar3;
        local_50 = local_50 + 1) {
      this->v_[local_50] = *(double *)(ytemp._0_8_ + (long)local_50 * 8);
    }
  }
  ~Mat((Mat *)local_28);
  return;
}

Assistant:

void Mat::Resize(int newn)
{
	Mat ytemp = (*this);
	if (newn != n_cols_*n_rows_) {
		if (v_ != NULL)
			delete[] (v_);	
		n_rows_ = newn;
		n_cols_ = 1;
		v_ = n_rows_*n_cols_ > 0 ? new double[n_rows_] : NULL;		
		for ( int i = 0; i < min(n_rows_,ytemp.n_rows_); i++)
			v_[i] = ytemp.v_[i];
	}
}